

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O3

word ** Io_ReadPlaCubeSetup(Vec_Str_t *vSop)

{
  uint uVar1;
  uint uVar2;
  word **ppwVar3;
  word *pwVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  byte *pSop;
  
  pSop = (byte *)vSop->pArray;
  uVar1 = Abc_SopGetCubeNum((char *)pSop);
  uVar2 = Abc_SopGetVarNum((char *)pSop);
  iVar10 = (((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0);
  ppwVar3 = (word **)malloc((long)(int)uVar1 * 8);
  pwVar4 = (word *)calloc((long)(int)(iVar10 * uVar1),8);
  *ppwVar3 = pwVar4;
  if (1 < (int)uVar1) {
    pwVar4 = *ppwVar3;
    uVar8 = 1;
    do {
      pwVar4 = pwVar4 + iVar10;
      ppwVar3[uVar8] = pwVar4;
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
  bVar6 = *pSop;
  if (bVar6 == 0) {
    lVar5 = 0;
LAB_003349d1:
    if ((uint)lVar5 != uVar1) {
      __assert_fail("c == nCubes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPla.c"
                    ,0x104,"word **Io_ReadPlaCubeSetup(Vec_Str_t *)");
    }
    return ppwVar3;
  }
  lVar5 = 0;
LAB_00334972:
  bVar7 = 0;
  uVar8 = 0;
  do {
    if (bVar6 < 0x31) {
      lVar9 = 1;
      if (bVar6 == 0x30) {
LAB_0033499c:
        ppwVar3[lVar5][uVar8 >> 5 & 0x7ffffff] =
             ppwVar3[lVar5][uVar8 >> 5 & 0x7ffffff] | lVar9 << (bVar7 & 0x3e);
      }
      else if ((bVar6 == 0) || (bVar6 == 0x20)) break;
    }
    else if (bVar6 == 0x31) {
      lVar9 = 2;
      goto LAB_0033499c;
    }
    bVar6 = pSop[uVar8 + 1];
    uVar8 = uVar8 + 1;
    bVar7 = bVar7 + 2;
  } while( true );
  lVar5 = lVar5 + 1;
  bVar6 = pSop[(int)(uVar2 + 3)];
  pSop = pSop + (int)(uVar2 + 3);
  if (bVar6 == 0) goto LAB_003349d1;
  goto LAB_00334972;
}

Assistant:

word ** Io_ReadPlaCubeSetup( Vec_Str_t * vSop )
{
    char * pSop = Vec_StrArray( vSop ), * pCube, Lit;
    int nCubes  = Abc_SopGetCubeNum( pSop );
    int nVars   = Abc_SopGetVarNum( pSop );
    int nWords  = Abc_Bit6WordNum( 2*nVars ), c, v;
    word ** pCs = ABC_ALLOC( word *, nCubes );
    pCs[0] = ABC_CALLOC( word, nCubes * nWords );
    for ( c = 1; c < nCubes; c++ )
        pCs[c] = pCs[c-1] + nWords;
    c = 0;
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        Abc_CubeForEachVar( pCube, Lit, v )
            if ( Lit == '0' )
                Abc_TtSetBit( pCs[c], Abc_Var2Lit(v,0) );
            else if ( Lit == '1' )
                Abc_TtSetBit( pCs[c], Abc_Var2Lit(v,1) );
        c++;
    }
    assert( c == nCubes );
    return pCs;
}